

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * fs_get_cache_file(string *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  long lVar2;
  runtime_error *this;
  string cache_directory;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar2 = std::__cxx11::string::find((char)filename,0x2f);
  if (lVar2 != -1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
               ,0x355,"GGML_ASSERT(%s) failed",
               "filename.find(DIRECTORY_SEPARATOR) == std::string::npos");
  }
  fs_get_cache_directory_abi_cxx11_();
  bVar1 = fs_create_directory_with_parents(&cache_directory);
  if (bVar1) {
    std::operator+(__return_storage_ptr__,&cache_directory,filename);
    std::__cxx11::string::~string((string *)&cache_directory);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"failed to create cache directory: ",&cache_directory);
  std::runtime_error::runtime_error(this,(string *)&local_40);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string fs_get_cache_file(const std::string & filename) {
    GGML_ASSERT(filename.find(DIRECTORY_SEPARATOR) == std::string::npos);
    std::string cache_directory = fs_get_cache_directory();
    const bool success = fs_create_directory_with_parents(cache_directory);
    if (!success) {
        throw std::runtime_error("failed to create cache directory: " + cache_directory);
    }
    return cache_directory + filename;
}